

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O1

char * __thiscall QLatin1::convertFromUnicode(QLatin1 *this,char *out,QStringView in,State *state)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  long lVar4;
  QLatin1 QVar5;
  storage_type_conflict *psVar6;
  
  puVar2 = (uint *)in.m_size;
  uVar1 = *puVar2;
  puVar3 = (uint *)0x0;
  QVar5 = (QLatin1)0x3f;
  if ((uVar1 & 1) == 0) {
    if ((*puVar2 & 2) == 0) {
      puVar3 = (uint *)0x3f;
    }
    QVar5 = SUB81(puVar3,0);
    puVar3 = puVar2;
  }
  if ((long)in.m_data < 1) {
    lVar4 = 0;
  }
  else {
    psVar6 = (storage_type_conflict *)0x0;
    lVar4 = 0;
    do {
      if (*(ushort *)(out + (long)psVar6 * 2) < 0x100) {
        this[(long)psVar6] = SUB21(*(ushort *)(out + (long)psVar6 * 2),0);
      }
      else {
        this[(long)psVar6] = QVar5;
        lVar4 = lVar4 + 1;
      }
      psVar6 = (storage_type_conflict *)((long)psVar6 + 1);
    } while (in.m_data != psVar6);
    this = this + (long)psVar6;
  }
  if ((uVar1 & 1) == 0) {
    *(long *)(puVar3 + 4) = *(long *)(puVar3 + 4) + lVar4;
  }
  return (char *)this;
}

Assistant:

char *QLatin1::convertFromUnicode(char *out, QStringView in, QStringConverter::State *state) noexcept
{
    Q_ASSERT(state);
    if (state->flags & QStringConverter::Flag::Stateless) // temporary
        state = nullptr;

    const char replacement = (state && state->flags & QStringConverter::Flag::ConvertInvalidToNull) ? 0 : '?';
    qsizetype invalid = 0;
    for (qsizetype i = 0; i < in.size(); ++i) {
        if (in[i] > QChar(0xff)) {
            *out = replacement;
            ++invalid;
        } else {
            *out = (char)in[i].cell();
        }
        ++out;
    }
    if (state)
        state->invalidChars += invalid;
    return out;
}